

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ref_matrix.c
# Opt level: O0

REF_STATUS ref_matrix_jacob_m(REF_DBL *m_upper_tri,REF_DBL *j)

{
  double dVar1;
  double dStack_88;
  REF_STATUS ref_private_macro_code_rss;
  REF_DBL d [12];
  REF_DBL *j_local;
  REF_DBL *m_upper_tri_local;
  
  m_upper_tri_local._4_4_ = ref_matrix_diag_m(m_upper_tri,&stack0xffffffffffffff78);
  if (m_upper_tri_local._4_4_ == 0) {
    dStack_88 = sqrt(dStack_88);
    d[0] = sqrt(d[0]);
    dVar1 = sqrt(d[1]);
    *j = dStack_88 * d[2];
    j[1] = dStack_88 * d[3];
    j[2] = dStack_88 * d[4];
    j[3] = d[0] * d[5];
    j[4] = d[0] * d[6];
    j[5] = d[0] * d[7];
    j[6] = dVar1 * d[8];
    j[7] = dVar1 * d[9];
    j[8] = dVar1 * d[10];
    m_upper_tri_local._4_4_ = 0;
  }
  else {
    printf("%s: %d: %s: %d %s\n",
           "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_matrix.c",0x1c0,
           "ref_matrix_jacob_m",(ulong)m_upper_tri_local._4_4_,"diag");
  }
  return m_upper_tri_local._4_4_;
}

Assistant:

REF_FCN REF_STATUS ref_matrix_jacob_m(REF_DBL *m_upper_tri, REF_DBL *j) {
  REF_DBL d[12];

  RSS(ref_matrix_diag_m(m_upper_tri, d), "diag");

  d[0] = sqrt(d[0]);
  d[1] = sqrt(d[1]);
  d[2] = sqrt(d[2]);

  j[0] = ref_matrix_eig(d, 0) * ref_matrix_vec(d, 0, 0);
  j[1] = ref_matrix_eig(d, 0) * ref_matrix_vec(d, 1, 0);
  j[2] = ref_matrix_eig(d, 0) * ref_matrix_vec(d, 2, 0);

  j[3] = ref_matrix_eig(d, 1) * ref_matrix_vec(d, 0, 1);
  j[4] = ref_matrix_eig(d, 1) * ref_matrix_vec(d, 1, 1);
  j[5] = ref_matrix_eig(d, 1) * ref_matrix_vec(d, 2, 1);

  j[6] = ref_matrix_eig(d, 2) * ref_matrix_vec(d, 0, 2);
  j[7] = ref_matrix_eig(d, 2) * ref_matrix_vec(d, 1, 2);
  j[8] = ref_matrix_eig(d, 2) * ref_matrix_vec(d, 2, 2);

  return REF_SUCCESS;
}